

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.h
# Opt level: O3

int CVmObjBigNum::compare_abs(char *ext1,char *ext2)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  byte bVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  char *pcVar11;
  
  bVar6 = (byte)ext2[4] >> 3 & 1;
  if ((ext1[4] & 8U) == 0) {
    iVar5 = 1;
    if (bVar6 == 0) {
      if ((*(short *)(ext1 + 2) <= *(short *)(ext2 + 2)) &&
         (iVar5 = -1, *(short *)(ext2 + 2) <= *(short *)(ext1 + 2))) {
        uVar1 = *(ushort *)ext1;
        uVar2 = *(ushort *)ext2;
        uVar9 = (uint)uVar1;
        uVar3 = uVar9;
        if (uVar1 < uVar2) {
          uVar3 = (uint)uVar2;
        }
        uVar4 = uVar9;
        if (uVar2 < uVar1) {
          uVar4 = (uint)uVar2;
        }
        uVar10 = (ulong)uVar4;
        pcVar11 = ext1;
        if (uVar1 < uVar2) {
          pcVar11 = ext2;
        }
        if (((((ushort)uVar4 < 2) ||
             (iVar5 = memcmp(ext1 + 5,ext2 + 5,(ulong)(uVar4 >> 1)), iVar5 == 0)) &&
            (((uVar4 & 1) == 0 ||
             (uVar7 = uVar10 - 1 >> 1,
             iVar5 = (uint)((byte)ext1[uVar7 + 5] >> 4) - (uint)((byte)ext2[uVar7 + 5] >> 4),
             iVar5 == 0)))) && (iVar5 = 0, (ushort)uVar4 < (ushort)uVar3)) {
          iVar8 = uVar4 * 4;
          do {
            if (((byte)pcVar11[(uVar10 >> 1) + 5] >> (~(byte)iVar8 & 4) & 0xf) != 0) {
              return uVar9 - uVar2;
            }
            uVar10 = uVar10 + 1;
            iVar8 = iVar8 + 4;
          } while (uVar3 != uVar10);
        }
      }
      return iVar5;
    }
  }
  else {
    iVar5 = (int)(char)(bVar6 - 1);
  }
  return iVar5;
}

Assistant:

static int is_zero(const char *ext)
        { return (ext[VMBN_FLAGS] & VMBN_F_ZERO) != 0; }